

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O3

size_t quantize_iq4_nl(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  float *L_00;
  float *pfVar1;
  long lVar2;
  float *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  uint16_t unused_h;
  long local_120;
  float scale;
  long local_110;
  long local_108;
  int64_t local_100;
  long local_f8;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  uint8_t L [32];
  float weight [32];
  
  if ((n_per_row & 0x1fU) == 0) {
    local_120 = n_per_row >> 5;
    if (0 < nrow) {
      local_110 = local_120 * 0x12;
      local_108 = n_per_row << 2;
      local_f8 = 0;
      local_100 = nrow;
      local_e0 = quant_weights;
      do {
        pfVar1 = quant_weights;
        lVar2 = local_120;
        local_f0 = src;
        local_e8 = (float *)dst;
        if (0 < local_120) {
          do {
            L_00 = pfVar1;
            if (quant_weights == (float *)0x0) {
              L_00 = (float *)0x0;
            }
            quantize_row_iq4_nl_impl
                      (0x20,(int)src,(float *)dst,(ggml_fp16_t *)((long)dst + 2),
                       (uint8_t *)&unused_h,(uint16_t *)0x0,(uint8_t *)&scale,weight,(float *)L,
                       (uint8_t *)L_00,(int8_t *)0x7,in_stack_fffffffffffffed0,
                       in_stack_fffffffffffffed8);
            dst = (void *)((long)dst + 0x12);
            src = src + 0x20;
            pfVar1 = pfVar1 + 0x20;
            lVar2 = lVar2 + -1;
            quant_weights = local_e0;
          } while (lVar2 != 0);
        }
        dst = (void *)((long)local_e8 + local_110);
        local_f8 = local_f8 + 1;
        src = (float *)((long)local_f0 + local_108);
        nrow = local_100;
      } while (local_f8 != local_100);
    }
    return nrow * local_120 * 0x12;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c",
             0x124d,"GGML_ASSERT(%s) failed","n_per_row%QK4_NL == 0");
}

Assistant:

size_t quantize_iq4_nl(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK4_NL == 0);
    int64_t nblock = n_per_row/QK4_NL;
    char * qrow = (char *)dst;
    uint8_t L[QK4_NL];
    float weight[QK4_NL];
    uint16_t unused_h;
    uint8_t * unused_l = NULL;
    float scale;
    for (int64_t row = 0; row < nrow; ++row) {
        block_iq4_nl * iq4 = (block_iq4_nl *)qrow;
        for (int ibl = 0; ibl < nblock; ++ibl) {
            const float * qw = quant_weights ? quant_weights + QK4_NL*ibl : NULL;
            quantize_row_iq4_nl_impl(QK4_NL, 32, src + QK4_NL*ibl, &iq4[ibl].d, iq4[ibl].qs, &unused_h, unused_l,
                    &scale, weight, L, kvalues_iq4nl, qw, 7);
        }
        src += n_per_row;
        qrow += nblock*sizeof(block_iq4_nl);
    }
    return nrow * nblock * sizeof(block_iq4_nl);
}